

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_layout_helper.cc
# Opt level: O3

void google::protobuf::compiler::cpp::MessageLayoutHelper::MaybeMergeHotIntoFast
               (FieldPartitionArray *field_groups)

{
  long lVar1;
  size_t f;
  long lVar2;
  FieldGroup *group;
  long *plVar3;
  long lVar4;
  vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
  *src_partition;
  FieldGroup *group_1;
  
  lVar1 = 0;
  lVar2 = 0;
  do {
    for (plVar3 = *(long **)&field_groups->_M_elems[lVar2].field_0x60;
        plVar3 != *(long **)&field_groups->_M_elems[lVar2].field_0x68; plVar3 = plVar3 + 4) {
      lVar1 = lVar1 + (plVar3[1] - *plVar3 >> 3);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  lVar2 = 0;
  lVar4 = 0;
  do {
    for (plVar3 = *(long **)&field_groups->_M_elems[lVar4].field_0x48;
        plVar3 != *(long **)&field_groups->_M_elems[lVar4].field_0x50; plVar3 = plVar3 + 4) {
      lVar2 = lVar2 + (plVar3[1] - *plVar3 >> 3);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  if ((ulong)(lVar2 + lVar1) < 0x21) {
    src_partition =
         (vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
          *)&field_groups->_M_elems[0].field_0x48;
    lVar1 = 5;
    do {
      if ((src_partition->
          super__Vector_base<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
          )._M_impl.super__Vector_impl_data._M_start !=
          (src_partition->
          super__Vector_base<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        FillPaddingFromPartition(src_partition + 1,src_partition,8);
        std::
        vector<google::protobuf::compiler::cpp::FieldGroup,std::allocator<google::protobuf::compiler::cpp::FieldGroup>>
        ::
        _M_range_insert<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup*,std::vector<google::protobuf::compiler::cpp::FieldGroup,std::allocator<google::protobuf::compiler::cpp::FieldGroup>>>>
                  ((vector<google::protobuf::compiler::cpp::FieldGroup,std::allocator<google::protobuf::compiler::cpp::FieldGroup>>
                    *)(src_partition + 1),
                   src_partition[1].
                   super__Vector_base<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (src_partition->
                   super__Vector_base<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                   )._M_impl.super__Vector_impl_data._M_start,
                   (src_partition->
                   super__Vector_base<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                   )._M_impl.super__Vector_impl_data._M_finish);
        std::
        vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
        ::_M_erase_at_end(src_partition,
                          (src_partition->
                          super__Vector_base<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                          )._M_impl.super__Vector_impl_data._M_start);
      }
      src_partition = src_partition + 6;
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  return;
}

Assistant:

void MessageLayoutHelper::MaybeMergeHotIntoFast(
    FieldPartitionArray& field_groups) {
  size_t num_fast_fields = 0;
  for (size_t f = 0; f < kMaxFamily; ++f) {
    for (const auto& group : field_groups[f][kFastParse]) {
      num_fast_fields += group.num_fields();
    }
  }

  size_t num_hot_fields = 0;
  for (size_t f = 0; f < kMaxFamily; ++f) {
    for (const auto& group : field_groups[f][kHot]) {
      num_hot_fields += group.num_fields();
    }
  }

  if (num_fast_fields + num_hot_fields <=
      internal::TailCallTableInfo::kMaxFastFieldHasbitIndex + 1) {
    for (size_t f = 0; f < kMaxFamily; ++f) {
      if (field_groups[f][kHot].empty()) {
        continue;
      }

      FillPaddingFromPartition(field_groups[f][kFastParse],
                               field_groups[f][kHot], /*alignment=*/8);

      // Append all remaining hot fields to the end of the fast parse group.
      field_groups[f][kFastParse].insert(field_groups[f][kFastParse].end(),
                                         field_groups[f][kHot].begin(),
                                         field_groups[f][kHot].end());
      field_groups[f][kHot].clear();
    }
  }
}